

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void kj::AsyncObject::failed(void)

{
  StringPtr *in_RCX;
  long in_FS_OFFSET;
  String local_28;
  Fault local_10;
  Fault f;
  
  str<char_const(&)[51],kj::StringPtr&>
            (&local_28,(kj *)"KJ async object being destroyed when not allowed: ",
             *(char (**) [51])(in_FS_OFFSET + -0x28),in_RCX);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::String>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x8e,FAILED,(char *)0x0,
             "kj::str(\"KJ async object being destroyed when not allowed: \", disallowAsyncDestructorsScope->reason)"
             ,&local_28);
  String::~String(&local_28);
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void AsyncObject::failed() noexcept {
  // Since the method is noexcept, this will abort the process.
  KJ_FAIL_REQUIRE(
      kj::str("KJ async object being destroyed when not allowed: ",
              disallowAsyncDestructorsScope->reason));
}